

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timezone.cpp
# Opt level: O0

void icu_63::TimeZone::adoptDefault(TimeZone *zone)

{
  UObject *pUVar1;
  TimeZone *pTVar2;
  TimeZone *old;
  TimeZone *zone_local;
  
  if (zone != (TimeZone *)0x0) {
    pTVar2 = zone;
    if (DEFAULT_ZONE != (TimeZone *)0x0) {
      pUVar1 = &DEFAULT_ZONE->super_UObject;
      DEFAULT_ZONE = zone;
      (*pUVar1->_vptr_UObject[1])();
      pTVar2 = DEFAULT_ZONE;
    }
    DEFAULT_ZONE = pTVar2;
    ucln_i18n_registerCleanup_63(UCLN_I18N_TIMEZONE,timeZone_cleanup);
  }
  return;
}

Assistant:

void U_EXPORT2
TimeZone::adoptDefault(TimeZone* zone)
{
    if (zone != NULL)
    {
        TimeZone *old = DEFAULT_ZONE;
        DEFAULT_ZONE = zone;
        delete old;
        ucln_i18n_registerCleanup(UCLN_I18N_TIMEZONE, timeZone_cleanup);
    }
}